

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_join.cpp
# Opt level: O1

void __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalComparisonJoin *join,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  byte bVar1;
  char cVar2;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *puVar3;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *puVar4;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var5;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var6;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var7;
  undefined8 uVar8;
  optional_ptr<duckdb::LogicalOperator,_true> oVar9;
  bool bVar10;
  bool bVar11;
  FilterPropagateResult FVar12;
  int iVar13;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_01;
  reference this_02;
  pointer pBVar14;
  type pBVar15;
  type pBVar16;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *puVar17;
  type left;
  type right;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> uVar18;
  pointer pEVar19;
  reference pvVar20;
  __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *p_Var21;
  reference pvVar22;
  LogicalLimit *this_03;
  pointer pLVar23;
  size_type __n;
  size_type __n_00;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var24;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *this_04;
  undefined1 auVar25 [16];
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats_right;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats_left;
  templated_unique_single_t limit;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  cross_product;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  updated_stats_right;
  undefined1 local_118 [16];
  optional_ptr<duckdb::LogicalOperator,_true> local_108;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_100;
  undefined1 local_f8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Stack_e0;
  undefined1 local_d0 [16];
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> local_c0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  local_b8 [2];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_a8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_a0;
  undefined1 local_98 [24];
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_80;
  vector<duckdb::JoinCondition,_true> *local_78;
  __node_base local_70;
  ClientContext *pCStack_68;
  LogicalOperator *local_60;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_58;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_50;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> _Stack_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Stack_38;
  
  if ((join->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
      .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (join->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
      .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start) {
    return;
  }
  local_78 = &join->conditions;
  local_b8[1].
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       &(join->super_LogicalJoin).join_stats;
  this_01 = &(join->super_LogicalJoin).super_LogicalOperator.children;
  __n = 0;
  local_108.ptr = (LogicalOperator *)this;
LAB_00d4bdea:
  this_02 = vector<duckdb::JoinCondition,_true>::operator[](local_78,__n);
  oVar9.ptr = local_108.ptr;
  PropagateExpression((StatisticsPropagator *)(local_118 + 8),
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)local_108.ptr);
  this_00 = &this_02->right;
  PropagateExpression((StatisticsPropagator *)local_118,
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)oVar9.ptr);
  if (((ClientContext *)local_118._8_8_ != (ClientContext *)0x0) &&
     ((Optimizer *)local_118._0_8_ != (Optimizer *)0x0)) {
    if ((this_02->comparison != COMPARE_BOUNDARY_END) &&
       (this_02->comparison != COMPARE_DISTINCT_FROM)) {
LAB_00d4be82:
      pBVar15 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)(local_118 + 8));
      pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)local_118);
      FVar12 = PropagateComparison((StatisticsPropagator *)local_108.ptr,pBVar15,pBVar16,
                                   this_02->comparison);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)(local_118 + 8));
      BaseStatistics::ToUnique((BaseStatistics *)local_f8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                  *)local_b8[1].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_f8);
      uVar8 = local_f8._0_8_;
      if ((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
          local_f8._0_8_ !=
          (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)0x0
         ) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_f8._0_8_);
        operator_delete((void *)uVar8);
      }
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_118);
      BaseStatistics::ToUnique((BaseStatistics *)local_f8);
      ::std::
      vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                  *)local_b8[1].
                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_f8);
      uVar8 = local_f8._0_8_;
      if ((BaseStatistics *)local_f8._0_8_ != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_f8._0_8_);
        operator_delete((void *)uVar8);
      }
      bVar10 = false;
      bVar11 = true;
      puVar17 = node_ptr;
      if (FVar12 == FILTER_ALWAYS_TRUE) {
        if (((join->super_LogicalJoin).super_LogicalOperator.type != LOGICAL_ASOF_JOIN) ||
           (3 < (byte)(this_02->comparison - COMPARE_LESSTHAN))) {
          if (1 < (ulong)(((long)(join->conditions).
                                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 .
                                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(join->conditions).
                                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 .
                                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555)) {
            vector<duckdb::JoinCondition,_true>::erase_at(local_78,__n);
            puVar3 = &((join->super_LogicalJoin).join_stats.
                       super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
            ;
            puVar4 = &((join->super_LogicalJoin).join_stats.
                       super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                      super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
            ;
            this_04 = puVar3;
            local_a0 = node_ptr;
            if (puVar4 != puVar3) {
              do {
                ::std::
                unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
                ~unique_ptr(this_04);
                this_04 = this_04 + 1;
              } while (this_04 != puVar4);
              (join->super_LogicalJoin).join_stats.
              super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar3;
            }
            __n = __n - 1;
            bVar10 = false;
            bVar11 = false;
            node_ptr = local_a0;
            goto switchD_00d4bf75_caseD_4;
          }
          switch((join->super_LogicalJoin).super_LogicalOperator.field_0x61) {
          case 3:
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_01,0);
            local_d0._8_8_ =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_01,1);
            local_d0._0_8_ =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            LogicalCrossProduct::Create
                      ((LogicalCrossProduct *)local_f8,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)(local_d0 + 8),
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)local_d0);
            if ((data_t  [8])local_d0._0_8_ != (data_t  [8])0x0) {
              (**(code **)(*(long *)local_d0._0_8_ + 8))();
            }
            local_d0[0] = '\0';
            local_d0[1] = '\0';
            local_d0[2] = '\0';
            local_d0[3] = '\0';
            local_d0[4] = '\0';
            local_d0[5] = '\0';
            local_d0[6] = '\0';
            local_d0[7] = '\0';
            if ((_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)local_d0._8_8_ !=
                (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0) {
              (**(code **)(*(long *)local_d0._8_8_ + 8))();
            }
            uVar8 = local_f8._0_8_;
            local_d0._8_8_ =
                 (tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)0x0;
            local_f8._0_8_ =
                 (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
            _Var5._M_head_impl =
                 (node_ptr->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (node_ptr->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)uVar8;
            _Var24._M_head_impl = (BaseStatistics *)local_f8._0_8_;
            if (_Var5._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var5._M_head_impl)->_vptr_LogicalOperator + 8))();
              _Var24._M_head_impl = (BaseStatistics *)local_f8._0_8_;
            }
            break;
          default:
            goto switchD_00d4bf75_caseD_4;
          case 6:
          case 10:
            goto switchD_00d4bf75_caseD_3;
          case 9:
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_01,0);
            pvVar22 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_01,1);
            _Var5._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var6._M_head_impl =
                 (pvVar22->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar22->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            _Var7._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 _Var6._M_head_impl;
            if (_Var7._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var7._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
            _Var6._M_head_impl =
                 (pvVar22->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar22->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 _Var5._M_head_impl;
            if (_Var6._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var6._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
          case 5:
            BoundLimitNode::ConstantValue((BoundLimitNode *)&local_50,1);
            BoundLimitNode::BoundLimitNode((BoundLimitNode *)&local_70);
            this_03 = (LogicalLimit *)operator_new(0xa8);
            local_f8._0_8_ = local_50._M_head_impl;
            local_f8._8_8_ = _Stack_48._M_head_impl;
            local_e8._M_pi = local_40;
            _Stack_e0.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (_Head_base<0UL,_duckdb::Expression_*,_false>)
                 (_Head_base<0UL,_duckdb::Expression_*,_false>)_Stack_38._M_head_impl;
            _Stack_38._M_head_impl = (Expression *)0x0;
            local_98._16_8_ = local_60;
            _Stack_80._M_head_impl = _Stack_58._M_head_impl;
            local_98._0_8_ = local_70._M_nxt;
            local_98._8_8_ = pCStack_68;
            _Stack_58._M_head_impl = (Expression *)0x0;
            LogicalLimit::LogicalLimit
                      (this_03,(BoundLimitNode *)local_f8,(BoundLimitNode *)local_98);
            local_100._M_head_impl = (BaseStatistics *)this_03;
            if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                _Stack_80._M_head_impl != (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
              (*(code *)((__node_base_ptr)
                        ((_Stack_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)[1].
                        _M_nxt)();
            }
            _Stack_80._M_head_impl = (Expression *)0x0;
            if (_Stack_e0.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                (Expression *)0x0) {
              (*(code *)((__node_base_ptr)
                        ((long)*(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                 *)_Stack_e0.super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                   _M_head_impl + 8))->_M_nxt)();
            }
            if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                _Stack_58._M_head_impl != (Expression *)0x0) {
              (*(code *)(*(__node_base_ptr *)_Stack_58._M_head_impl)[1]._M_nxt)();
            }
            if (_Stack_38._M_head_impl != (Expression *)0x0) {
              (**(code **)&((((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                               *)&((_Stack_38._M_head_impl)->super_BaseExpression).
                                  _vptr_BaseExpression)->_M_t).
                            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                           type)();
            }
            pLVar23 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                                    *)&local_100);
            LogicalOperator::SetEstimatedCardinality(&pLVar23->super_LogicalOperator,1);
            pLVar23 = unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalLimit,_std::default_delete<duckdb::LogicalLimit>,_true>
                                    *)&local_100);
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_01,1);
            local_b8[0].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )(pvVar20->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            LogicalOperator::AddChild(&pLVar23->super_LogicalOperator,local_b8);
            if (local_b8[0].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)local_b8[0].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl + 8))();
            }
            local_b8[0].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )(__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                   )0x0;
            pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      ::operator[](this_01,0);
            local_c0.
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )local_100._M_head_impl;
            local_a8._M_head_impl =
                 (pvVar20->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (pvVar20->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)0x0;
            local_100._M_head_impl = (BaseStatistics *)0x0;
            LogicalCrossProduct::Create
                      ((LogicalCrossProduct *)local_f8,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&local_a8,&local_c0);
            if (local_c0.
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)local_c0.
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl + 8))();
            }
            local_c0.
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )(__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
                   )0x0;
            if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
                 )local_a8._M_head_impl != (BaseStatistics *)0x0) {
              (*(local_a8._M_head_impl)->_vptr_LogicalOperator[1])();
            }
            uVar8 = local_f8._0_8_;
            local_a8._M_head_impl = (LogicalOperator *)0x0;
            local_f8._0_8_ = (BaseStatistics *)0x0;
            _Var5._M_head_impl =
                 (node_ptr->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (node_ptr->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)uVar8;
            if (_Var5._M_head_impl != (LogicalOperator *)0x0) {
              (**(code **)((long)(_Var5._M_head_impl)->_vptr_LogicalOperator + 8))();
            }
            _Var24._M_head_impl = local_100._M_head_impl;
            if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                 )local_f8._0_8_ != (BaseStatistics *)0x0) {
              (**(code **)(*(long *)local_f8._0_8_ + 8))();
              _Var24._M_head_impl = local_100._M_head_impl;
            }
          }
          if ((tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
              _Var24._M_head_impl != (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
            (*(*(_func_int ***)&(_Var24._M_head_impl)->type)[1])();
          }
          goto LAB_00d4c062;
        }
        bVar10 = false;
      }
      else {
        bVar10 = false;
        if ((FVar12 != FILTER_ALWAYS_FALSE) && (FVar12 != FILTER_FALSE_OR_NULL))
        goto switchD_00d4bf75_caseD_4;
        bVar1 = (join->super_LogicalJoin).super_LogicalOperator.field_0x61;
        __n_00 = (size_type)bVar1;
        switch(bVar1) {
        case 2:
          __n_00 = 0;
        case 1:
          puVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_01,__n_00);
        case 3:
        case 5:
        case 9:
          goto switchD_00d4bf75_caseD_3;
        default:
          goto switchD_00d4bf75_caseD_4;
        case 10:
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_01,0);
          pvVar22 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_01,1);
          _Var5._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          _Var6._M_head_impl =
               (pvVar22->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar22->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          _Var7._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var6._M_head_impl
          ;
          if (_Var7._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var7._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
          _Var6._M_head_impl =
               (pvVar22->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar22->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var5._M_head_impl
          ;
          if (_Var6._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var6._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
        case 6:
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_01,0);
          _Var5._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (pvVar20->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          _Var6._M_head_impl =
               (node_ptr->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (node_ptr->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = _Var5._M_head_impl
          ;
          bVar10 = true;
          if (_Var6._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var6._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
        }
      }
      goto LAB_00d4c068;
    }
    pBVar14 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)(local_118 + 8));
    bVar10 = BaseStatistics::CanHaveNull(pBVar14);
    if (!bVar10) goto LAB_00d4be82;
    pBVar14 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)local_118);
    bVar11 = BaseStatistics::CanHaveNull(pBVar14);
    bVar10 = false;
    if (!bVar11) goto LAB_00d4be82;
    goto LAB_00d4c287;
  }
  goto LAB_00d4c072;
switchD_00d4bf75_caseD_3:
  ReplaceWithEmptyResult((StatisticsPropagator *)local_108.ptr,puVar17);
LAB_00d4c062:
  bVar10 = true;
LAB_00d4c068:
  bVar11 = false;
switchD_00d4bf75_caseD_4:
  if (bVar11) {
LAB_00d4c072:
    bVar10 = false;
    if ((this_02->comparison != COMPARE_DISTINCT_FROM) &&
       (this_02->comparison != COMPARE_BOUNDARY_END)) {
      cVar2 = (join->super_LogicalJoin).super_LogicalOperator.field_0x61;
      bVar10 = false;
      if ((cVar2 == '\x05') || (cVar2 == '\x03')) {
        left = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this_02->left);
        right = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(this_00);
        UpdateFilterStatistics((StatisticsPropagator *)local_108.ptr,left,right,this_02->comparison)
        ;
        oVar9.ptr = local_108.ptr;
        PropagateExpression((StatisticsPropagator *)local_f8,
                            (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)local_108.ptr);
        uVar18 = PropagateExpression((StatisticsPropagator *)local_98,
                                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                      *)oVar9.ptr);
        auVar25._0_4_ = -(uint)(SUB84(local_118._8_8_,4) == 0 && (int)local_118._8_8_ == 0);
        auVar25._4_4_ = -(uint)((int)local_118._0_8_ == 0 && SUB84(local_118._0_8_,4) == 0);
        auVar25._8_4_ = -(uint)(SUB84(local_f8._0_8_,4) == 0 && (int)local_f8._0_8_ == 0);
        auVar25._12_4_ = -(uint)((int)local_98._0_8_ == 0 && SUB84(local_98._0_8_,4) == 0);
        iVar13 = movmskps((int)uVar18.
                               super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                               ._M_t.
                               super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
                               .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl,
                          auVar25);
        if (((iVar13 == 0) &&
            (pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(&this_02->left),
            (pEVar19->super_BaseExpression).type == BOUND_COLUMN_REF)) &&
           (pEVar19 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(this_00),
           (pEVar19->super_BaseExpression).type == BOUND_COLUMN_REF)) {
          local_a0 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                     ::operator[](this_01,0);
          pBVar15 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)(local_118 + 8));
          pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)local_f8);
          CreateFilterFromJoinStats
                    ((StatisticsPropagator *)local_108.ptr,local_a0,&this_02->left,pBVar15,pBVar16);
          pvVar20 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    ::operator[](this_01,1);
          pBVar15 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)local_118);
          pBVar16 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                                 *)local_98);
          CreateFilterFromJoinStats
                    ((StatisticsPropagator *)local_108.ptr,pvVar20,this_00,pBVar15,pBVar16);
        }
        if ((long)(join->super_LogicalJoin).join_stats.
                  super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(join->super_LogicalJoin).join_stats.
                  super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x10) {
          p_Var21 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                       ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                     *)local_b8[1].
                                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                       _M_head_impl,0);
          uVar8 = local_f8._0_8_;
          local_f8._0_8_ = (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0;
          ::std::
          __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          reset(p_Var21,(pointer)uVar8);
          p_Var21 = (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                     *)vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                       ::operator[]((vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
                                     *)local_b8[1].
                                       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                       ._M_t.
                                       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                       _M_head_impl,1);
          uVar8 = local_98._0_8_;
          local_98._0_8_ =
               (__uniq_ptr_data<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true,_true>
                )0x0;
          ::std::
          __uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
          reset(p_Var21,(pointer)uVar8);
        }
        uVar8 = local_98._0_8_;
        if ((BaseStatistics *)local_98._0_8_ != (BaseStatistics *)0x0) {
          BaseStatistics::~BaseStatistics((BaseStatistics *)local_98._0_8_);
          operator_delete((void *)uVar8);
        }
        uVar8 = local_f8._0_8_;
        if ((LogicalOperator *)local_f8._0_8_ != (LogicalOperator *)0x0) {
          BaseStatistics::~BaseStatistics((BaseStatistics *)local_f8._0_8_);
          operator_delete((void *)uVar8);
        }
      }
    }
  }
LAB_00d4c287:
  uVar8 = local_118._0_8_;
  if ((Optimizer *)local_118._0_8_ != (Optimizer *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_118._0_8_);
    operator_delete((void *)uVar8);
  }
  uVar8 = local_118._8_8_;
  if ((ClientContext *)local_118._8_8_ != (ClientContext *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_118._8_8_);
    operator_delete((void *)uVar8);
  }
  if (bVar10) {
    return;
  }
  __n = __n + 1;
  if ((ulong)(((long)(join->conditions).
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(join->conditions).
                     super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                     super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) <= __n)
  {
    return;
  }
  goto LAB_00d4bdea;
}

Assistant:

void StatisticsPropagator::PropagateStatistics(LogicalComparisonJoin &join, unique_ptr<LogicalOperator> &node_ptr) {
	for (idx_t i = 0; i < join.conditions.size(); i++) {
		auto &condition = join.conditions[i];
		const auto stats_left = PropagateExpression(condition.left);
		const auto stats_right = PropagateExpression(condition.right);
		if (stats_left && stats_right) {
			if ((condition.comparison == ExpressionType::COMPARE_DISTINCT_FROM ||
			     condition.comparison == ExpressionType::COMPARE_NOT_DISTINCT_FROM) &&
			    stats_left->CanHaveNull() && stats_right->CanHaveNull()) {
				// null values are equal in this join, and both sides can have null values
				// nothing to do here
				continue;
			}
			auto prune_result = PropagateComparison(*stats_left, *stats_right, condition.comparison);
			// Add stats to logical_join for perfect hash join
			join.join_stats.push_back(stats_left->ToUnique());
			join.join_stats.push_back(stats_right->ToUnique());
			switch (prune_result) {
			case FilterPropagateResult::FILTER_FALSE_OR_NULL:
			case FilterPropagateResult::FILTER_ALWAYS_FALSE:
				// filter is always false or null, none of the join conditions matter
				switch (join.join_type) {
				case JoinType::RIGHT_SEMI:
				case JoinType::SEMI:
				case JoinType::INNER:
					// semi or inner join on false; entire node can be pruned
					ReplaceWithEmptyResult(node_ptr);
					return;
				case JoinType::RIGHT_ANTI:
				case JoinType::ANTI: {
					if (join.join_type == JoinType::RIGHT_ANTI) {
						std::swap(join.children[0], join.children[1]);
					}
					// If the filter is always false or Null, just return the left child.
					node_ptr = std::move(join.children[0]);
					return;
				}
				case JoinType::LEFT:
					// anti/left outer join: replace right side with empty node
					ReplaceWithEmptyResult(join.children[1]);
					return;
				case JoinType::RIGHT:
					// right outer join: replace left side with empty node
					ReplaceWithEmptyResult(join.children[0]);
					return;
				default:
					// other join types: can't do much meaningful with this information
					// full outer join requires both sides anyway; we can skip the execution of the actual join, but eh
					// mark/single join requires knowing if the rhs has null values or not
					break;
				}
				break;
			case FilterPropagateResult::FILTER_ALWAYS_TRUE:
				// filter is always true
				// If this is the inequality for an AsOf join,
				// then we must leave it in because it also flags
				// the semantics of restricting to a single match
				// so we can't replace it with an equi-join on the remaining conditions.
				if (join.type == LogicalOperatorType::LOGICAL_ASOF_JOIN) {
					switch (condition.comparison) {
					case ExpressionType::COMPARE_GREATERTHAN:
					case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
					case ExpressionType::COMPARE_LESSTHAN:
					case ExpressionType::COMPARE_LESSTHANOREQUALTO:
						continue;
					default:
						break;
					}
				}
				if (join.conditions.size() > 1) {
					// there are multiple conditions: erase this condition
					join.conditions.erase_at(i);
					// remove the corresponding statistics
					join.join_stats.clear();
					i--;
					continue;
				} else {
					// this is the only condition and it is always true: all conditions are true
					switch (join.join_type) {
					case JoinType::RIGHT_SEMI:
					case JoinType::SEMI: {
						if (join.join_type == JoinType::RIGHT_SEMI) {
							std::swap(join.children[0], join.children[1]);
						}
						// when the right child has no data, return an empty set
						// cannot just return the left child because if the right child has no cardinality
						// then the whole result should be empty.
						// TODO: write better CE logic for limits so that we can just look at
						//  join.children[1].estimated_cardinality.
						auto limit = make_uniq<LogicalLimit>(BoundLimitNode::ConstantValue(1), BoundLimitNode());
						limit->SetEstimatedCardinality(1);
						limit->AddChild(std::move(join.children[1]));
						auto cross_product = LogicalCrossProduct::Create(std::move(join.children[0]), std::move(limit));
						node_ptr = std::move(cross_product);
						return;
					}
					case JoinType::INNER: {
						// inner, replace with cross product
						auto cross_product =
						    LogicalCrossProduct::Create(std::move(join.children[0]), std::move(join.children[1]));
						node_ptr = std::move(cross_product);
						return;
					}
					case JoinType::ANTI:
					case JoinType::RIGHT_ANTI: {
						ReplaceWithEmptyResult(node_ptr);
						return;
					}
					default:
						// we don't handle mark/single join here yet
						break;
					}
				}
				break;
			default:
				break;
			}
		}
		// after we have propagated, we can update the statistics on both sides
		// note that it is fine to do this now, even if the same column is used again later
		// e.g. if we have i=j AND i=k, and the stats for j and k are disjoint, we know there are no results
		// so if we have e.g. i: [0, 100], j: [0, 25], k: [75, 100]
		// we can set i: [0, 25] after the first comparison, and statically determine that the second comparison is fals

		// note that we can't update statistics the same for all join types
		// mark and single joins don't filter any tuples -> so there is no propagation possible
		// anti joins have inverse statistics propagation
		// (i.e. if we have an anti join on i: [0, 100] and j: [0, 25], the resulting stats are i:[25,100])
		// for now we don't handle anti joins
		if (condition.comparison == ExpressionType::COMPARE_DISTINCT_FROM ||
		    condition.comparison == ExpressionType::COMPARE_NOT_DISTINCT_FROM) {
			// skip update when null values are equal (for now?)
			continue;
		}
		switch (join.join_type) {
		case JoinType::INNER:
		case JoinType::SEMI: {
			UpdateFilterStatistics(*condition.left, *condition.right, condition.comparison);
			auto updated_stats_left = PropagateExpression(condition.left);
			auto updated_stats_right = PropagateExpression(condition.right);

			// Try to push lhs stats down rhs and vice versa
			if (stats_left && stats_right && updated_stats_left && updated_stats_right &&
			    condition.left->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF &&
			    condition.right->GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
				CreateFilterFromJoinStats(join.children[0], condition.left, *stats_left, *updated_stats_left);
				CreateFilterFromJoinStats(join.children[1], condition.right, *stats_right, *updated_stats_right);
			}

			// Update join_stats when is already part of the join
			if (join.join_stats.size() == 2) {
				join.join_stats[0] = std::move(updated_stats_left);
				join.join_stats[1] = std::move(updated_stats_right);
			}
			break;
		}
		default:
			break;
		}
	}
}